

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O2

long __thiscall dlib::drawable::width(drawable *this)

{
  unsigned_long uVar1;
  auto_mutex M;
  
  M.r = this->m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  uVar1 = rectangle::width(&this->rect);
  auto_mutex::~auto_mutex(&M);
  return uVar1;
}

Assistant:

long width (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.width(); 
        }